

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uLong cm_zlib_crc32_combine_op(uLong crc1,uLong crc2,uLong op)

{
  z_crc_t zVar1;
  
  zVar1 = multmodp((z_crc_t)op,(z_crc_t)crc1);
  return crc2 & 0xffffffff ^ (ulong)zVar1;
}

Assistant:

uLong ZEXPORT crc32_combine_op(uLong crc1, uLong crc2, uLong op) {
    return multmodp(op, crc1) ^ (crc2 & 0xffffffff);
}